

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

archive_entry * archive_entry_clear(archive_entry *entry)

{
  archive_entry *entry_local;
  
  if (entry == (archive_entry *)0x0) {
    entry_local = (archive_entry *)0x0;
  }
  else {
    archive_mstring_clean(&entry->ae_fflags_text);
    archive_mstring_clean(&entry->ae_gname);
    archive_mstring_clean(&entry->ae_linkname);
    archive_mstring_clean(&entry->ae_pathname);
    archive_mstring_clean(&entry->ae_sourcepath);
    archive_mstring_clean(&entry->ae_uname);
    archive_entry_copy_mac_metadata(entry,(void *)0x0,0);
    archive_acl_clear(&entry->acl);
    archive_entry_xattr_clear(entry);
    archive_entry_sparse_clear(entry);
    free(entry->stat);
    entry->ae_symlink_type = L'\0';
    memset(entry,0,0x498);
    entry_local = entry;
  }
  return entry_local;
}

Assistant:

struct archive_entry *
archive_entry_clear(struct archive_entry *entry)
{
	if (entry == NULL)
		return (NULL);
	archive_mstring_clean(&entry->ae_fflags_text);
	archive_mstring_clean(&entry->ae_gname);
	archive_mstring_clean(&entry->ae_linkname);
	archive_mstring_clean(&entry->ae_pathname);
	archive_mstring_clean(&entry->ae_sourcepath);
	archive_mstring_clean(&entry->ae_uname);
	archive_entry_copy_mac_metadata(entry, NULL, 0);
	archive_acl_clear(&entry->acl);
	archive_entry_xattr_clear(entry);
	archive_entry_sparse_clear(entry);
	free(entry->stat);
	entry->ae_symlink_type = AE_SYMLINK_TYPE_UNDEFINED;
	memset(entry, 0, sizeof(*entry));
	return entry;
}